

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void Map_Remove(Map *tree,void *str,size_t size)

{
  Map *data;
  size_t sVar1;
  ulong uVar2;
  void *__ptr;
  long lVar3;
  Stack stk;
  byte local_41;
  Stack local_40;
  
  Stack_Init(&local_40);
  local_41 = *str;
  Stack_Push(&local_40,tree);
  for (lVar3 = 0; lVar3 != size - 1; lVar3 = lVar3 + 1) {
    uVar2 = (ulong)*(byte *)((long)str + lVar3);
    data = tree->delta[uVar2];
    if (data == (Map *)0x0) goto LAB_001437f8;
    if (data->is_final == '\x01') {
      while (local_40.size != 0) {
        Stack_Pop(&local_40);
      }
      local_41 = *(byte *)((long)str + lVar3 + 1);
    }
    Stack_Push(&local_40,data);
    tree = data;
  }
  uVar2 = (ulong)*(byte *)((long)str + (size - 1));
LAB_001437f8:
  if (tree->delta[uVar2] != (Map *)0x0) {
    free(tree->delta[uVar2]);
    while( true ) {
      sVar1 = local_40.size;
      __ptr = Stack_Pop(&local_40);
      if (sVar1 < 2) break;
      free(__ptr);
    }
    *(undefined8 *)((long)__ptr + (ulong)local_41 * 8 + 8) = 0;
  }
  return;
}

Assistant:

void Map_Remove(Map *tree, void *str,size_t size)
{
	Stack stk;
	Stack_Init(&stk);
	size_t where;
	char what_to_null=((char*)str)[0];

	Stack_Push(&stk,tree);

	for(where=0;where<size-1 && tree->delta[((unsigned char*)str)[where]]!=NULL;++where)
	{
		tree = tree->delta[((unsigned char*)str)[where]];
		if(tree->is_final==1)
		{
			while(stk.size>0)Stack_Pop(&stk);
			what_to_null=((char*)str)[where+1];
		}
		Stack_Push(&stk,tree);
	}
	if(tree->delta[((unsigned char*)str)[where]] == NULL)return;
	free(tree->delta[((unsigned char*)str)[where]]);
	while(stk.size>1)free(Stack_Pop(&stk));
	tree=(Map*)Stack_Pop(&stk);
	tree->delta[(unsigned char)what_to_null]=NULL;
	
}